

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary.cpp
# Opt level: O3

spv_result_t __thiscall
anon_unknown.dwarf_474aba::Parser::setNumericTypeInfoForType
          (Parser *this,spv_parsed_operand_t *parsed_operand,uint32_t type_id)

{
  uint uVar1;
  spv_number_kind_t sVar2;
  uint32_t uVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  _Hash_node_base *p_Var6;
  ulong uVar7;
  long lVar8;
  char *pcVar9;
  DiagnosticStream DStack_1e8;
  
  if (type_id == 0) {
    __assert_fail("type_id != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/binary.cpp"
                  ,0x32b,
                  "spv_result_t (anonymous namespace)::Parser::setNumericTypeInfoForType(spv_parsed_operand_t *, uint32_t)"
                 );
  }
  uVar4 = (this->_).type_id_to_number_type_info._M_h._M_bucket_count;
  uVar7 = (ulong)type_id % uVar4;
  p_Var5 = (this->_).type_id_to_number_type_info._M_h._M_buckets[uVar7];
  if (p_Var5 != (__node_base_ptr)0x0) {
    p_Var6 = p_Var5->_M_nxt;
    uVar1 = *(uint *)&p_Var6[1]._M_nxt;
    do {
      if (uVar1 == type_id) {
        sVar2 = *(spv_number_kind_t *)((long)&p_Var6[1]._M_nxt + 4);
        if (sVar2 != SPV_NUMBER_NONE) {
          parsed_operand->number_kind = sVar2;
          uVar3 = *(uint32_t *)&p_Var6[2]._M_nxt;
          parsed_operand->number_bit_width = uVar3;
          parsed_operand->num_words = (uint16_t)(uVar3 + 0x1f >> 5);
          return SPV_SUCCESS;
        }
        diagnostic(&DStack_1e8,(Parser *)this->consumer_,(spv_result_t)(this->_).instruction_count);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1e8,"Type Id ",8);
        std::ostream::_M_insert<unsigned_long>((ulong)&DStack_1e8);
        pcVar9 = " is not a scalar numeric type";
        lVar8 = 0x1d;
        goto LAB_001b16f4;
      }
      p_Var6 = p_Var6->_M_nxt;
    } while ((p_Var6 != (_Hash_node_base *)0x0) &&
            (uVar1 = *(uint *)&p_Var6[1]._M_nxt, (ulong)uVar1 % uVar4 == uVar7));
  }
  diagnostic(&DStack_1e8,(Parser *)this->consumer_,(spv_result_t)(this->_).instruction_count);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1e8,"Type Id ",8);
  std::ostream::_M_insert<unsigned_long>((ulong)&DStack_1e8);
  pcVar9 = " is not a type";
  lVar8 = 0xe;
LAB_001b16f4:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&DStack_1e8,pcVar9,lVar8);
  spvtools::DiagnosticStream::~DiagnosticStream(&DStack_1e8);
  return DStack_1e8.error_;
}

Assistant:

spv_result_t Parser::setNumericTypeInfoForType(
    spv_parsed_operand_t* parsed_operand, uint32_t type_id) {
  assert(type_id != 0);
  auto type_info_iter = _.type_id_to_number_type_info.find(type_id);
  if (type_info_iter == _.type_id_to_number_type_info.end()) {
    return diagnostic() << "Type Id " << type_id << " is not a type";
  }
  const NumberType& info = type_info_iter->second;
  if (info.type == SPV_NUMBER_NONE) {
    // This is a valid type, but for something other than a scalar number.
    return diagnostic() << "Type Id " << type_id
                        << " is not a scalar numeric type";
  }

  parsed_operand->number_kind = info.type;
  parsed_operand->number_bit_width = info.bit_width;
  // Round up the word count.
  parsed_operand->num_words = static_cast<uint16_t>((info.bit_width + 31) / 32);
  return SPV_SUCCESS;
}